

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleParser.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  Slice slice;
  allocator<char> local_11a;
  allocator<char> local_119;
  shared_ptr<arangodb::velocypack::Builder> b;
  string json;
  string local_e8;
  string local_c8;
  Parser parser;
  HexDump local_68;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&json,"{\"a\":12}",(allocator<char> *)&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"Parsing JSON string \'");
  poVar1 = std::operator<<(poVar1,(string *)&json);
  poVar1 = std::operator<<(poVar1,"\'");
  std::endl<char,std::char_traits<char>>(poVar1);
  arangodb::velocypack::Parser::Parser(&parser);
  arangodb::velocypack::Parser::parse
            (&parser,(uint8_t *)json._M_dataplus._M_p,json._M_string_length,false);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of values: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  arangodb::velocypack::Parser::steal((Parser *)&b);
  poVar1 = std::operator<<((ostream *)&std::cout,"Resulting VPack:");
  std::endl<char,std::char_traits<char>>(poVar1);
  slice = arangodb::velocypack::Builder::slice
                    (b.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8," ",&local_119);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"0x",&local_11a);
  arangodb::velocypack::HexDump::HexDump(&local_68,slice,0x10,&local_c8,&local_e8);
  poVar1 = arangodb::velocypack::operator<<((ostream *)&std::cout,&local_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  arangodb::velocypack::HexDump::~HexDump(&local_68);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser._builder.
              super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&json);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // this is the JSON string we are going to parse
  std::string const json = "{\"a\":12}";
  std::cout << "Parsing JSON string '" << json << "'" << std::endl;

  Parser parser;
  try {
    ValueLength nr = parser.parse(json);
    std::cout << "Number of values: " << nr << std::endl;
  } catch (std::bad_alloc const&) {
    std::cout << "Out of memory!" << std::endl;
    throw;
  } catch (Exception const& ex) {
    std::cout << "Parse error: " << ex.what() << std::endl;
    std::cout << "Position of error: " << parser.errorPos() << std::endl;
    throw;
  }

  // get a pointer to the start of the data
  std::shared_ptr<Builder> b = parser.steal();

  // now dump the resulting VPack value
  std::cout << "Resulting VPack:" << std::endl;
  std::cout << HexDump(b->slice()) << std::endl;

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}